

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.hpp
# Opt level: O2

invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
* __thiscall
njoy::ENDFtk::section::Type<26>::ContinuumEnergyAngle::Base::F0
          (invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
           *__return_storage_ptr__,Base *this)

{
  view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_long>_> vw;
  
  vw.super_bind_back_fn_<ranges::views::stride_base_fn,_long>.fn_args_.arg_ =
       (long)((this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 1);
  vw.super_bind_back_fn_<ranges::views::stride_base_fn,_long>.fn_args_._0_8_ =
       (this->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ranges::views::view_closure_base_ns::
  operator|<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_long>,_true,_0,_0>
            (__return_storage_ptr__,
             (subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>
              *)&stack0xffffffffffffffe8,vw);
  return __return_storage_ptr__;
}

Assistant:

auto F0() const {

    return ranges::views::drop_exactly( ListRecord::list(), 1 )
             | ranges::views::stride( 2 + this->NA() );
  }